

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O3

void __thiscall
QtMWidgets::DateTimePicker::DateTimePicker(DateTimePicker *this,QDate *date,QWidget *parent)

{
  Scroller *pSVar1;
  QDate QVar2;
  DateTimePickerPrivate *this_00;
  undefined4 *puVar3;
  QDate local_60;
  undefined8 local_58;
  code *local_50;
  ImplFn local_48;
  QObject local_40 [8];
  QObject local_38 [8];
  QObject local_30 [8];
  
  QWidget::QWidget(&this->super_QWidget,parent,0);
  *(undefined ***)this = &PTR_metaObject_00191858;
  *(undefined ***)&this->field_0x10 = &PTR__DateTimePicker_00191a08;
  this_00 = (DateTimePickerPrivate *)operator_new(0xa8);
  DateTimePickerPrivate::DateTimePickerPrivate(this_00,this,QDate);
  (this->d).d = this_00;
  QWidget::setSizePolicy((QSizePolicy)SUB84(this,0));
  QVar2.jd = date->jd;
  if (0x16d3e147973 < date->jd + 0xb69eeff91fU) {
    QDate::QDate(&local_60,100,1,1);
    QVar2.jd = local_60.jd;
  }
  local_60.jd = QVar2.jd;
  setDate(this,&local_60);
  pSVar1 = ((this->d).d)->scroller;
  local_60.jd = (qint64)Scroller::aboutToStart;
  local_58 = 0;
  local_50 = _q_scrollAboutToStart;
  local_48 = (ImplFn)0x0;
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::QSlotObject<void_(QtMWidgets::DateTimePicker::*)(),_QtPrivate::List<>,_void>::impl
  ;
  *(code **)(puVar3 + 4) = _q_scrollAboutToStart;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_30,(void **)pSVar1,(QObject *)&local_60,(void **)this,
             (QSlotObjectBase *)&local_50,(ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_30);
  pSVar1 = ((this->d).d)->scroller;
  local_60.jd = (qint64)Scroller::scroll;
  local_58 = 0;
  local_50 = _q_scroll;
  local_48 = (ImplFn)0x0;
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::
       QSlotObject<void_(QtMWidgets::DateTimePicker::*)(int,_int),_QtPrivate::List<int,_int>,_void>
       ::impl;
  *(code **)(puVar3 + 4) = _q_scroll;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_38,(void **)pSVar1,(QObject *)&local_60,(void **)this,
             (QSlotObjectBase *)&local_50,(ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  pSVar1 = ((this->d).d)->scroller;
  local_60.jd = (qint64)Scroller::finished;
  local_58 = 0;
  local_50 = _q_scrollFinished;
  local_48 = (ImplFn)0x0;
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::QSlotObject<void_(QtMWidgets::DateTimePicker::*)(),_QtPrivate::List<>,_void>::impl
  ;
  *(code **)(puVar3 + 4) = _q_scrollFinished;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_40,(void **)pSVar1,(QObject *)&local_60,(void **)this,
             (QSlotObjectBase *)&local_50,(ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  return;
}

Assistant:

DateTimePicker::DateTimePicker( const QDate & date, QWidget * parent )
	:	QWidget( parent )
	,	d( new DateTimePickerPrivate( this, QMetaType::QDate ) )
{
	setSizePolicy( QSizePolicy( QSizePolicy::Fixed,
		QSizePolicy::Fixed ) );

	setDate( date.isValid() ? date : DATETIMEPICKER_DATE_MIN );

	connect( d->scroller, &Scroller::aboutToStart,
		this, &DateTimePicker::_q_scrollAboutToStart );

	connect( d->scroller, &Scroller::scroll,
		this, &DateTimePicker::_q_scroll );

	connect( d->scroller, &Scroller::finished,
		this, &DateTimePicker::_q_scrollFinished );
}